

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.h
# Opt level: O0

FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>
* __thiscall
spvtools::opt::
MakeFilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>
          (FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>
           *__return_storage_ptr__,opt *this,
          _Node_iterator<spvtools::opt::Instruction_*,_true,_false> *begin,
          _Node_iterator<spvtools::opt::Instruction_*,_true,_false> *end,
          ExcludePhiDefinedInBlock predicate)

{
  IRContext *pIVar1;
  ExcludePhiDefinedInBlock predicate_00;
  IteratorRange<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>_> local_38;
  _Node_iterator<spvtools::opt::Instruction_*,_true,_false> *local_28;
  _Node_iterator<spvtools::opt::Instruction_*,_true,_false> *end_local;
  _Node_iterator<spvtools::opt::Instruction_*,_true,_false> *begin_local;
  ExcludePhiDefinedInBlock predicate_local;
  
  pIVar1 = predicate.context_;
  local_28 = begin;
  end_local = (_Node_iterator<spvtools::opt::Instruction_*,_true,_false> *)this;
  begin_local = end;
  predicate_local.context_ = pIVar1;
  local_38 = make_range<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>>
                       ((_Node_iterator<spvtools::opt::Instruction_*,_true,_false> *)this,begin);
  predicate_00.bb_ = (BasicBlock *)pIVar1;
  predicate_00.context_ = predicate_local.context_;
  MakeFilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>
            (__return_storage_ptr__,(opt *)&local_38,
             (IteratorRange<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>_>
              *)begin_local,predicate_00);
  return __return_storage_ptr__;
}

Assistant:

FilterIterator<SubIterator, Predicate> MakeFilterIterator(
    const SubIterator& begin, const SubIterator& end, Predicate predicate) {
  return MakeFilterIterator(make_range(begin, end), predicate);
}